

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implicit_weak_message.h
# Opt level: O1

uint8 * __thiscall
google::protobuf::internal::ImplicitWeakMessage::_InternalSerialize
          (ImplicitWeakMessage *this,uint8 *target,EpsCopyOutputStream *stream)

{
  pointer data;
  int size;
  uint8 *puVar1;
  size_t __n;
  
  data = (this->data_)._M_dataplus._M_p;
  size = (int)(this->data_)._M_string_length;
  __n = (size_t)size;
  if ((long)__n <= (long)stream->end_ - (long)target) {
    memcpy(target,data,__n);
    return target + __n;
  }
  puVar1 = io::EpsCopyOutputStream::WriteRawFallback(stream,data,size,target);
  return puVar1;
}

Assistant:

uint8* _InternalSerialize(uint8* target,
                            io::EpsCopyOutputStream* stream) const final {
    return stream->WriteRaw(data_.data(), static_cast<int>(data_.size()),
                            target);
  }